

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

void fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(uint64_t *out1,uint64_t *arg1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  
  uVar1 = arg1[1];
  uVar2 = arg1[2];
  uVar3 = arg1[3];
  uVar4 = arg1[4];
  uVar5 = arg1[5];
  uVar6 = arg1[6];
  uVar7 = arg1[7];
  uVar8 = arg1[8];
  uVar9 = arg1[9];
  *out1 = 0x1ffffffffffb8e - *arg1;
  out1[1] = 0xffffffffffffe - uVar1;
  out1[2] = 0xffffffffffffe - uVar2;
  out1[3] = 0xffffffffffffe - uVar3;
  out1[4] = 0xffffffffffffe - uVar4;
  out1[5] = 0x1ffffffffffffe - uVar5;
  out1[6] = 0xffffffffffffe - uVar6;
  out1[7] = 0xffffffffffffe - uVar7;
  out1[8] = 0xffffffffffffe - uVar8;
  out1[9] = 0xffffffffffffe - uVar9;
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(
    uint64_t out1[10], const uint64_t arg1[10]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    x1 = (UINT64_C(0x1ffffffffffb8e) - (arg1[0]));
    x2 = (UINT64_C(0xffffffffffffe) - (arg1[1]));
    x3 = (UINT64_C(0xffffffffffffe) - (arg1[2]));
    x4 = (UINT64_C(0xffffffffffffe) - (arg1[3]));
    x5 = (UINT64_C(0xffffffffffffe) - (arg1[4]));
    x6 = (UINT64_C(0x1ffffffffffffe) - (arg1[5]));
    x7 = (UINT64_C(0xffffffffffffe) - (arg1[6]));
    x8 = (UINT64_C(0xffffffffffffe) - (arg1[7]));
    x9 = (UINT64_C(0xffffffffffffe) - (arg1[8]));
    x10 = (UINT64_C(0xffffffffffffe) - (arg1[9]));
    out1[0] = x1;
    out1[1] = x2;
    out1[2] = x3;
    out1[3] = x4;
    out1[4] = x5;
    out1[5] = x6;
    out1[6] = x7;
    out1[7] = x8;
    out1[8] = x9;
    out1[9] = x10;
}